

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# txmempool.cpp
# Opt level: O0

void __thiscall CTxMemPool::CTxMemPool(CTxMemPool *this,Options opts,bilingual_str *error)

{
  long lVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  int iVar10;
  int iVar11;
  rep rVar12;
  CAmount CVar13;
  CAmount CVar14;
  CAmount CVar15;
  int64_t iVar16;
  int *piVar17;
  Options *pOVar18;
  long in_RDI;
  long in_FS_OFFSET;
  Epoch *in_stack_ffffffffffffff78;
  multi_index_container<CTxMemPoolEntry,_CTxMemPool::CTxMemPoolEntry_Indices,_std::allocator<CTxMemPoolEntry>_>
  *in_stack_ffffffffffffffa8;
  bilingual_str *in_stack_ffffffffffffffb0;
  
  pOVar18 = (Options *)&stack0x00000008;
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  std::atomic<unsigned_int>::atomic((atomic<unsigned_int> *)in_stack_ffffffffffffff78,0);
  *(undefined8 *)(in_RDI + 8) = 0;
  *(undefined8 *)(in_RDI + 0x10) = 0;
  *(undefined8 *)(in_RDI + 0x18) = 0;
  iVar16 = GetTime();
  *(int64_t *)(in_RDI + 0x20) = iVar16;
  *(undefined1 *)(in_RDI + 0x28) = 0;
  *(undefined8 *)(in_RDI + 0x30) = 0;
  *(undefined8 *)(in_RDI + 0x38) = 0;
  *(undefined8 *)(in_RDI + 0x40) = 0;
  Epoch::Epoch(in_stack_ffffffffffffff78);
  *(undefined8 *)(in_RDI + 0x48) = 1;
  *(undefined1 *)(in_RDI + 0x50) = 0;
  AnnotatedMixin<std::recursive_mutex>::AnnotatedMixin
            ((AnnotatedMixin<std::recursive_mutex> *)in_stack_ffffffffffffff78);
  boost::multi_index::
  multi_index_container<CTxMemPoolEntry,_CTxMemPool::CTxMemPoolEntry_Indices,_std::allocator<CTxMemPoolEntry>_>
  ::multi_index_container(in_stack_ffffffffffffffa8);
  std::
  vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  ::vector((vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
            *)in_stack_ffffffffffffff78);
  _GLOBAL__N_1::std::set<uint256,_std::less<uint256>,_std::allocator<uint256>_>::set
            ((set<uint256,_std::less<uint256>,_std::allocator<uint256>_> *)in_stack_ffffffffffffff78
            );
  indirectmap<COutPoint,_const_CTransaction_*>::indirectmap
            ((indirectmap<COutPoint,_const_CTransaction_*> *)in_stack_ffffffffffffff78);
  std::map<uint256,_long,_std::less<uint256>,_std::allocator<std::pair<const_uint256,_long>_>_>::map
            ((map<uint256,_long,_std::less<uint256>,_std::allocator<std::pair<const_uint256,_long>_>_>
              *)in_stack_ffffffffffffff78);
  piVar17 = (int *)(in_RDI + 0x1e0);
  pOVar18 = Flatten(pOVar18,in_stack_ffffffffffffffb0);
  *(ValidationSignals **)(piVar17 + 0x18) = pOVar18->signals;
  iVar16 = (pOVar18->limits).descendant_size_vbytes;
  *(int64_t *)(piVar17 + 0x14) = (pOVar18->limits).descendant_count;
  *(int64_t *)(piVar17 + 0x16) = iVar16;
  iVar16 = (pOVar18->limits).ancestor_size_vbytes;
  *(int64_t *)(piVar17 + 0x10) = (pOVar18->limits).ancestor_count;
  *(int64_t *)(piVar17 + 0x12) = iVar16;
  iVar2 = pOVar18->check_ratio;
  iVar3 = *(int *)&pOVar18->field_0x4;
  iVar16 = pOVar18->max_size_bytes;
  iVar4 = *(int *)((long)&pOVar18->max_size_bytes + 4);
  rVar12 = (pOVar18->expiry).__r;
  iVar5 = *(int *)((long)&(pOVar18->expiry).__r + 4);
  CVar13 = (pOVar18->incremental_relay_feerate).nSatoshisPerK;
  iVar6 = *(int *)((long)&(pOVar18->incremental_relay_feerate).nSatoshisPerK + 4);
  CVar14 = (pOVar18->min_relay_feerate).nSatoshisPerK;
  iVar7 = *(int *)((long)&(pOVar18->min_relay_feerate).nSatoshisPerK + 4);
  CVar15 = (pOVar18->dust_relay_feerate).nSatoshisPerK;
  iVar8 = *(int *)((long)&(pOVar18->dust_relay_feerate).nSatoshisPerK + 4);
  iVar9 = *(int *)&(pOVar18->max_datacarrier_bytes).super__Optional_base<unsigned_int,_true,_true>.
                   _M_payload.super__Optional_payload_base<unsigned_int>._M_engaged;
  iVar10 = *(int *)&pOVar18->permit_bare_multisig;
  iVar11 = *(int *)&pOVar18->field_0x3c;
  *(_Storage<unsigned_int,_true> *)(piVar17 + 0xc) =
       (pOVar18->max_datacarrier_bytes).super__Optional_base<unsigned_int,_true,_true>._M_payload.
       super__Optional_payload_base<unsigned_int>._M_payload;
  piVar17[0xd] = iVar9;
  piVar17[0xe] = iVar10;
  piVar17[0xf] = iVar11;
  piVar17[8] = (int)CVar14;
  piVar17[9] = iVar7;
  piVar17[10] = (int)CVar15;
  piVar17[0xb] = iVar8;
  piVar17[4] = (int)rVar12;
  piVar17[5] = iVar5;
  piVar17[6] = (int)CVar13;
  piVar17[7] = iVar6;
  *piVar17 = iVar2;
  piVar17[1] = iVar3;
  piVar17[2] = (int)iVar16;
  piVar17[3] = iVar4;
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

CTxMemPool::CTxMemPool(Options opts, bilingual_str& error)
    : m_opts{Flatten(std::move(opts), error)}
{
}